

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,QChar *c)

{
  bool bVar1;
  QTextStreamPrivate *ch;
  QTextStreamPrivate *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  TokenDelimiter in_stack_0000000c;
  QTextStreamPrivate *d;
  QTextStreamPrivate *in_stack_00000028;
  char *in_stack_ffffffffffffffa8;
  Status status;
  QTextStream *local_30;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ch = d_func((QTextStream *)0x4aa53f);
  if ((ch->string == (QString *)0x0) && (ch->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RSI,(char *)ch,(int)((ulong)in_RDI >> 0x20),
               in_stack_ffffffffffffffa8);
    QMessageLogger::warning(&local_28,"QTextStream: No device");
    local_30 = in_RDI;
  }
  else {
    QTextStreamPrivate::scan
              (in_stack_00000028,(QChar **)this,(qsizetype *)c,(qsizetype)d,in_stack_0000000c);
    status = (Status)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    bVar1 = QTextStreamPrivate::getChar(in_RSI,(QChar *)ch);
    local_30 = in_RDI;
    if (!bVar1) {
      setStatus(in_RDI,status);
      local_30 = in_RDI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QTextStream &QTextStream::operator>>(QChar &c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    if (!d->getChar(&c))
        setStatus(ReadPastEnd);
    return *this;
}